

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_inter.c
# Opt level: O3

void sys_microsleep(void)

{
  int microsec;
  
  pthread_mutex_lock((pthread_mutex_t *)&sys_mutex);
  microsec = sched_get_sleepgrain();
  sys_domicrosleep(microsec);
  pthread_mutex_unlock((pthread_mutex_t *)&sys_mutex);
  return;
}

Assistant:

void sys_lock(void)
{
#ifdef PDINSTANCE
    pthread_mutex_lock(&INTER->i_mutex);
    pthread_rwlock_rdlock(&sys_rwlock);
    pd_this->pd_islocked = 1;
#else
    pthread_mutex_lock(&sys_mutex);
#endif
}